

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

char * __thiscall
cppnet::BufferBlock::_FindStrInMem
          (BufferBlock *this,char *buffer,char *ch,uint32_t buffer_len,uint32_t ch_len)

{
  int iVar1;
  BufferBlock *__s1;
  long local_50;
  size_t finded;
  char *find;
  char *buff;
  char *buffer_end;
  uint32_t ch_len_local;
  uint32_t buffer_len_local;
  char *ch_local;
  char *buffer_local;
  BufferBlock *this_local;
  
  if (buffer != (char *)0x0) {
    local_50 = 0;
    find = buffer;
    while ((__s1 = (BufferBlock *)memchr(find,(int)*ch,(ulong)buffer_len - local_50),
           __s1 != (BufferBlock *)0x0 &&
           (__s1 <= (BufferBlock *)(buffer + ((ulong)buffer_len - (ulong)ch_len))))) {
      iVar1 = memcmp(__s1,ch,(ulong)ch_len);
      if (iVar1 == 0) {
        return (char *)__s1;
      }
      local_50 = local_50 + (1 - (long)find) + (long)&__s1->super_InnerBuffer;
      if ((ulong)buffer_len - local_50 < (ulong)ch_len) {
        return (char *)(BufferBlock *)0x0;
      }
      find = (char *)((long)&(__s1->super_InnerBuffer).super_Buffer._vptr_Buffer + 1);
    }
  }
  return (char *)(BufferBlock *)0x0;
}

Assistant:

const char* BufferBlock::_FindStrInMem(const char* buffer, const char* ch, uint32_t buffer_len, uint32_t ch_len) const {
    if (!buffer) {
        return nullptr;
    }

    const char* buffer_end = buffer + buffer_len;
    const char* buff = buffer;
    const char* find = nullptr;
    size_t finded = 0;
    while(true) {
        find = (char*)memchr(buff, *ch, buffer_len - finded);
        if (!find || find > buffer_end - ch_len) {
            break;
        }
        
        if (memcmp(find, ch, ch_len) == 0) {
            return find;
        }
        finded += find - buff + 1;
        if (buffer_len - finded < ch_len) {
            break;
        }
        buff = ++find;
    }
    return nullptr;
}